

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Catch::Generators::
makeGenerators<std::__cxx11::string,char_const(&)[6],char_const(&)[4],char_const(&)[6],char_const(&)[4]>
          (Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Generators *this,char (*param_3) [4],char (*param_4) [6],
          char (*param_5) [4])

{
  allocator local_51;
  _Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(char *)this,&local_51);
  value<std::__cxx11::string>((Generators *)&local_50,&local_48);
  Generators<std::__cxx11::string>::
  Generators<Catch::Generators::GeneratorWrapper<std::__cxx11::string>,char_const(&)[4],char_const(&)[6],char_const(&)[4]>
            ((Generators<std::__cxx11::string> *)__return_storage_ptr__,
             (GeneratorWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,param_3,param_4,param_5);
  if (local_50._M_head_impl !=
      (IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    (*((local_50._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  local_50._M_head_impl =
       (IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( as<T>, U&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( T( std::forward<U>( val ) ) ), std::forward<Gs>( moreGenerators )... );
    }